

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

BOOL Js::CustomExternalWrapperObject::DefineOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  int iVar6;
  BOOL BVar7;
  CustomExternalWrapperObject *this_00;
  JavascriptFunction *function;
  undefined4 *puVar8;
  Var pvVar9;
  Var pvVar10;
  JavascriptMethod p_Var11;
  RecyclableObject *ptr;
  PropertyDescriptor *currentDescriptor;
  char *this_01;
  Type local_c8;
  Var isPropertyNameNumeric;
  undefined1 local_98 [8];
  PropertyDescriptor targetDescriptor;
  Var propertyNameNumericValue;
  
  ThreadContext::ProbeStack(requestContext->threadContext,0xc00,requestContext,(PVOID)0x0);
  this = requestContext->threadContext;
  this_00 = VarTo<Js::CustomExternalWrapperObject,Js::RecyclableObject>(obj);
  BVar5 = EnsureInitialized(this_00,requestContext);
  if (BVar5 == 0) {
    return 0;
  }
  pvVar9 = *(Var *)&((this_00->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache
                    .ptr)->elements[3].field_0x8;
  if (pvVar9 == (Var)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(pvVar9);
  }
  this_01 = (char *)requestContext->recycler;
  bVar3 = Memory::Recycler::IsHeapEnumInProgress((Recycler *)this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x20f,"(!requestContext->IsHeapEnumInProgress())",
                                "!requestContext->IsHeapEnumInProgress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98,descriptor);
    if (targetDescriptor.originalVar.ptr._3_1_ == '\x01') {
      pvVar9 = CrossSite::MarshalVar
                         ((((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                          ).scriptContext.ptr,(descriptor->Value).ptr,false);
      PropertyDescriptor::SetValue((PropertyDescriptor *)local_98,pvVar9);
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&stack0xffffffffffffff38);
    BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                      (obj,propId,requestContext,(PropertyDescriptor *)&stack0xffffffffffffff38);
    iVar6 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])(obj);
    currentDescriptor = (PropertyDescriptor *)0x0;
    if (BVar5 != 0) {
      currentDescriptor = (PropertyDescriptor *)&stack0xffffffffffffff38;
    }
    BVar5 = JavascriptOperators::ValidateAndApplyPropertyDescriptor<true>
                      (obj,propId,(PropertyDescriptor *)local_98,currentDescriptor,iVar6 != 0,
                       throwOnError,requestContext);
    return BVar5;
  }
  pvVar9 = (descriptor->originalVar).ptr;
  if (pvVar9 == (Var)0x0) {
    this_01 = (char *)descriptor;
    pvVar9 = JavascriptOperators::FromPropertyDescriptor(descriptor,requestContext);
  }
  pvVar10 = GetName((CustomExternalWrapperObject *)this_01,requestContext,propId,
                    &stack0xffffffffffffff38.ptr,(Var *)&targetDescriptor.Configurable);
  bVar3 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar4 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)function,attributes);
  if (bVar4) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var11)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,obj
                     ,pvVar10,local_c8.ptr,targetDescriptor._40_8_,pvVar9);
    bVar4 = ThreadContext::IsOnStack(ptr);
LAB_00b4048d:
    if (bVar4 != false) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (this->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var11)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,
                       obj,pvVar10,local_c8.ptr,targetDescriptor._40_8_,pvVar9);
      bVar4 = ThreadContext::IsOnStack(ptr);
      goto LAB_00b4048d;
    }
    IVar1 = this->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var11)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,obj
                     ,pvVar10,local_c8.ptr,targetDescriptor._40_8_,pvVar9);
    this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  this->reentrancySafeOrHandled = bVar3;
  BVar5 = JavascriptConversion::ToBoolean(ptr,requestContext);
  if (BVar5 == 0) {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
    BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                      (obj,propId,requestContext,(PropertyDescriptor *)local_98);
    iVar6 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])(obj);
    if (descriptor->configurableSpecified == true) {
      bVar3 = PropertyDescriptor::IsConfigurable(descriptor);
      bVar3 = !bVar3;
    }
    else {
      bVar3 = false;
    }
    if (BVar5 == 0) {
      if (!(bool)(iVar6 != 0 & (bVar3 ^ 1U))) goto LAB_00b40777;
    }
    else {
      BVar7 = JavascriptOperators::IsCompatiblePropertyDescriptor
                        (descriptor,(PropertyDescriptor *)local_98,iVar6 != 0,true,requestContext);
      if ((BVar7 == 0) ||
         ((bVar3 && (bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_98),
                    bVar3)))) {
LAB_00b40777:
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
      }
    }
  }
  return BVar5;
}

Assistant:

BOOL CustomExternalWrapperObject::DefineOwnPropertyDescriptor(Js::RecyclableObject * obj, Js::PropertyId propId, const Js::PropertyDescriptor& descriptor, bool throwOnError, Js::ScriptContext * requestContext)
{
    PROBE_STACK(requestContext, Js::Constants::MinStackDefault);

    ThreadContext* threadContext = requestContext->GetThreadContext();

    CustomExternalWrapperObject * customObject = VarTo<CustomExternalWrapperObject>(obj);

    if (!customObject->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    Js::RecyclableObject * targetObj = obj;

    CustomExternalWrapperType * type = customObject->GetExternalType();
    Js::JavascriptFunction* defineOwnPropertyMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->definePropertyTrap != nullptr)
    {
        defineOwnPropertyMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->definePropertyTrap);
    }

    Assert(!requestContext->IsHeapEnumInProgress());
    if (nullptr == defineOwnPropertyMethod)
    {
        Js::PropertyDescriptor desc = descriptor;

        if(desc.ValueSpecified())
        {
            // setting the value could be deferred and now we are on a different context from
            // make sure the value has the same context as the containing object.
            desc.SetValue(Js::CrossSite::MarshalVar(targetObj->GetScriptContext(), descriptor.GetValue()));
        }

        PropertyDescriptor currentDescriptor;
        BOOL isCurrentDescriptorDefined = JavascriptOperators::GetOwnPropertyDescriptor(obj, propId, requestContext, &currentDescriptor);

        bool isExtensible = !!obj->IsExtensible();
        return Js::JavascriptOperators::ValidateAndApplyPropertyDescriptor<true>(obj, propId, desc, isCurrentDescriptorDefined ? &currentDescriptor : nullptr, isExtensible, throwOnError, requestContext);
    }

    Js::Var descVar = descriptor.GetOriginal();
    if (descVar == nullptr)
    {
        descVar = Js::JavascriptOperators::FromPropertyDescriptor(descriptor, requestContext);
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = customObject->GetName(requestContext, propId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Js::Var definePropertyResult = threadContext->ExecuteImplicitCall(defineOwnPropertyMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, defineOwnPropertyMethod, Js::CallInfo(Js::CallFlags_Value, 5), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue, descVar);
    });

    BOOL defineResult = Js::JavascriptConversion::ToBoolean(definePropertyResult, requestContext);
    if (defineResult)
    {
        return defineResult;
    }

    Js::PropertyDescriptor targetDescriptor;
    BOOL hasProperty = Js::JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propId, requestContext, &targetDescriptor);
    BOOL isExtensible = targetObj->IsExtensible();
    BOOL settingConfigFalse = (descriptor.ConfigurableSpecified() && !descriptor.IsConfigurable());
    if (!hasProperty)
    {
        if (!isExtensible || settingConfigFalse)
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
        }
    }
    else
    {
        if (!Js::JavascriptOperators::IsCompatiblePropertyDescriptor(descriptor, hasProperty ? &targetDescriptor : nullptr, !!isExtensible, true, requestContext))
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
        }
        if (settingConfigFalse && targetDescriptor.IsConfigurable())
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
        }
    }
    return hasProperty;
}